

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

int __thiscall glcts::ViewportArrayTests::init(ViewportArrayTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParams;
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x2b0);
  extParams = &(this->super_TestCaseGroupBase).m_extParams;
  ViewportArray::APIErrors::APIErrors
            ((APIErrors *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::Queries::Queries
            ((Queries *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::ViewportAPI::ViewportAPI
            ((ViewportAPI *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::ScissorAPI::ScissorAPI
            ((ScissorAPI *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::DepthRangeAPI::DepthRangeAPI
            ((DepthRangeAPI *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::ScissorTestStateAPI::ScissorTestStateAPI
            ((ScissorTestStateAPI *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::DrawToSingleLayerWithMultipleViewports::DrawToSingleLayerWithMultipleViewports
            ((DrawToSingleLayerWithMultipleViewports *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::DynamicViewportIndex::DynamicViewportIndex
            ((DynamicViewportIndex *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::DrawMulitpleViewportsWithSingleInvocation::
  DrawMulitpleViewportsWithSingleInvocation
            ((DrawMulitpleViewportsWithSingleInvocation *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::ViewportIndexSubroutine::ViewportIndexSubroutine
            ((ViewportIndexSubroutine *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::DrawMultipleLayers::DrawMultipleLayers
            ((DrawMultipleLayers *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::Scissor::Scissor
            ((Scissor *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::ScissorZeroDimension::ScissorZeroDimension
            ((ScissorZeroDimension *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::ScissorClear::ScissorClear
            ((ScissorClear *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::DepthRange::DepthRange
            ((DepthRange *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::DepthRangeDepthTest::DepthRangeDepthTest
            ((DepthRangeDepthTest *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2b0);
  ViewportArray::ProvokingVertex::ProvokingVertex
            ((ProvokingVertex *)pTVar1,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void ViewportArrayTests::init(void)
{
	addChild(new ViewportArray::APIErrors(m_context, m_extParams));
	addChild(new ViewportArray::Queries(m_context, m_extParams));
	addChild(new ViewportArray::ViewportAPI(m_context, m_extParams));
	addChild(new ViewportArray::ScissorAPI(m_context, m_extParams));
	addChild(new ViewportArray::DepthRangeAPI(m_context, m_extParams));
	addChild(new ViewportArray::ScissorTestStateAPI(m_context, m_extParams));
	addChild(new ViewportArray::DrawToSingleLayerWithMultipleViewports(m_context, m_extParams));
	addChild(new ViewportArray::DynamicViewportIndex(m_context, m_extParams));
	addChild(new ViewportArray::DrawMulitpleViewportsWithSingleInvocation(m_context, m_extParams));
	addChild(new ViewportArray::ViewportIndexSubroutine(m_context, m_extParams));
	addChild(new ViewportArray::DrawMultipleLayers(m_context, m_extParams));
	addChild(new ViewportArray::Scissor(m_context, m_extParams));
	addChild(new ViewportArray::ScissorZeroDimension(m_context, m_extParams));
	addChild(new ViewportArray::ScissorClear(m_context, m_extParams));
	addChild(new ViewportArray::DepthRange(m_context, m_extParams));
	addChild(new ViewportArray::DepthRangeDepthTest(m_context, m_extParams));
	addChild(new ViewportArray::ProvokingVertex(m_context, m_extParams));
}